

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_bson.hpp
# Opt level: O0

type jsoncons::bson::
     encode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               bson_encode_options *options)

{
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_RDX;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  bson_stream_encoder encoder;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *to;
  binary_stream_sink *sink;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_fffffffffffffef0
  ;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  binary_stream_sink *in_stack_ffffffffffffff10;
  basic_json_visitor<char> in_stack_ffffffffffffff18;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  
  to = (basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
       &stack0xffffffffffffff18;
  binary_stream_sink::binary_stream_sink(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  sink = (binary_stream_sink *)&stack0xffffffffffffff17;
  std::allocator<char>::allocator();
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_bson_encoder
            (in_stack_fffffffffffffef0,sink,(bson_encode_options *)in_RDX,(allocator<char> *)to);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
  binary_stream_sink::~binary_stream_sink((binary_stream_sink *)in_stack_fffffffffffffef0);
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>>
            (to);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_ffffffffffffff20,
             (basic_json_visitor<char> *)in_stack_ffffffffffffff18._vptr_basic_json_visitor);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
              *)0x28b11e);
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_bson_encoder
            (in_RDX);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_bson(const T& j, 
                std::ostream& os, 
                const bson_encode_options& options = bson_encode_options())
    {
        using char_type = typename T::char_type;
        bson_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }